

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O2

int Abc_NodeRemoveDupFanins_int(Abc_Obj_t *pNode)

{
  uint uVar1;
  Abc_Ntk_t *pAVar2;
  void **ppvVar3;
  int *piVar4;
  DdManager *dd;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *n;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  pAVar2 = pNode->pNtk;
  if ((pAVar2->ntkFunc == ABC_FUNC_BDD) && (pAVar2->ntkType == ABC_NTK_LOGIC)) {
    if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                    ,0x94,"int Abc_NodeRemoveDupFanins_int(Abc_Obj_t *)");
    }
    uVar1 = (pNode->vFanins).nSize;
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    uVar7 = 0;
    while( true ) {
      uVar9 = (ulong)uVar1;
      if (uVar7 < uVar1) {
        uVar9 = uVar7;
      }
      if (uVar7 == uVar8) break;
      ppvVar3 = pAVar2->vObjs->pArray;
      piVar4 = (pNode->vFanins).pArray;
      for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        if (ppvVar3[piVar4[uVar10]] == ppvVar3[piVar4[uVar7]]) {
          dd = (DdManager *)pAVar2->pManFunc;
          pDVar5 = Cudd_bddIthVar(dd,(int)uVar7);
          pDVar6 = Cudd_bddIthVar(dd,(int)uVar10);
          n = Cudd_bddXnor(dd,pDVar5,pDVar6);
          Cudd_Ref(n);
          pDVar5 = (DdNode *)(pNode->field_5).pData;
          pDVar6 = Cudd_bddAndAbstract(dd,pDVar5,n,pDVar6);
          (pNode->field_5).pData = pDVar6;
          Cudd_Ref(pDVar6);
          Cudd_RecursiveDeref(dd,pDVar5);
          Cudd_RecursiveDeref(dd,n);
          Abc_NodeMinimumBase(pNode);
          return 1;
        }
      }
      uVar7 = uVar7 + 1;
    }
    return 0;
  }
  __assert_fail("Abc_NtkIsBddLogic(pNode->pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcMinBase.c"
                ,0x93,"int Abc_NodeRemoveDupFanins_int(Abc_Obj_t *)");
}

Assistant:

int Abc_NodeRemoveDupFanins_int( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanin1, * pFanin2;
    int i, k;
    assert( Abc_NtkIsBddLogic(pNode->pNtk) );
    assert( Abc_ObjIsNode(pNode) );
    // make sure fanins are not duplicated
    Abc_ObjForEachFanin( pNode, pFanin2, i )
    {
        Abc_ObjForEachFanin( pNode, pFanin1, k )
        {
            if ( k >= i )
                break;
            if ( pFanin1 == pFanin2 )
            {
                DdManager * dd = (DdManager *)pNode->pNtk->pManFunc;
                DdNode * bVar1 = Cudd_bddIthVar( dd, i );
                DdNode * bVar2 = Cudd_bddIthVar( dd, k );
                DdNode * bTrans, * bTemp;
                bTrans = Cudd_bddXnor( dd, bVar1, bVar2 ); Cudd_Ref( bTrans );
                pNode->pData = Cudd_bddAndAbstract( dd, bTemp = (DdNode *)pNode->pData, bTrans, bVar2 ); Cudd_Ref( (DdNode *)pNode->pData );
                Cudd_RecursiveDeref( dd, bTemp );
                Cudd_RecursiveDeref( dd, bTrans );
                Abc_NodeMinimumBase( pNode );
                return 1;
            }
        }
    }
    return 0;
}